

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall QString::arg_impl(QString *this,QAnyStringView a,int fieldWidth,QChar fillChar)

{
  long lVar1;
  QStringView s;
  QStringView s_00;
  storage_type_conflict *in_RSI;
  QAnyStringView *in_RDI;
  undefined2 in_R9W;
  long in_FS_OFFSET;
  QStringView sv;
  ArgEscapeData d;
  anon_struct_536_1_ba1d6aae convert;
  QString *in_stack_fffffffffffffcb8;
  anon_struct_536_1_ba1d6aae *in_stack_fffffffffffffcc0;
  QString *in_stack_fffffffffffffcc8;
  QStringView *in_stack_fffffffffffffcd0;
  QAnyStringView *this_00;
  QAnyStringView *pQVar2;
  ArgEscapeData *in_stack_fffffffffffffd70;
  qsizetype field_width;
  QChar fillChar_00;
  undefined8 uVar3;
  undefined6 in_stack_fffffffffffffdc8;
  QStringView in_stack_fffffffffffffde0;
  QStringView in_stack_fffffffffffffdf0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  field_width = -0x5555555555555556;
  fillChar_00.ucs = L'ꪪ';
  uVar3 = 0xaaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  pQVar2 = in_RDI;
  QStringView::QStringView<QString,_true>(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  s.m_size = (qsizetype)pQVar2;
  s.m_data = in_RSI;
  findArgEscapes(s);
  if (field_width == 0) {
    QString((QString *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  }
  else {
    memset(&stack0xfffffffffffffde0,0xaa,0x218);
    arg_impl(QAnyStringView,int,QChar)::__0((anon_struct_536_1_ba1d6aae *)0x1579dd);
    std::ref<QString::arg_impl(QAnyStringView,int,QChar)const::__0>(in_stack_fffffffffffffcc0);
    QAnyStringView::
    visit<std::reference_wrapper<QString::arg_impl(QAnyStringView,int,QChar)const::__0>>
              (this_00,(reference_wrapper<(unnamed_struct_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_text_qstring_cpp:8810:5)>
                        *)in_RDI);
    QStringView::QStringView<QString,_true>(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    s_00.m_size._0_6_ = in_stack_fffffffffffffdc8;
    s_00.m_data = (storage_type_conflict *)uVar3;
    s_00.m_size._6_2_ = in_R9W;
    replaceArgEscapes(s_00,in_stack_fffffffffffffd70,field_width,in_stack_fffffffffffffde0,
                      in_stack_fffffffffffffdf0,fillChar_00);
    arg_impl(QAnyStringView,int,QChar)::~__0((anon_struct_536_1_ba1d6aae *)0x157aed);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QString *)this_00;
}

Assistant:

QString QString::arg_impl(QAnyStringView a, int fieldWidth, QChar fillChar) const
{
    ArgEscapeData d = findArgEscapes(*this);

    if (Q_UNLIKELY(d.occurrences == 0)) {
        qWarning("QString::arg: Argument missing: \"%ls\", \"%ls\"", qUtf16Printable(*this),
                  qUtf16Printable(a.toString()));
        return *this;
    }
    struct {
        QVarLengthArray<char16_t> out;
        QStringView operator()(QStringView in) noexcept { return in; }
        QStringView operator()(QLatin1StringView in)
        {
            out.resize(in.size());
            qt_from_latin1(out.data(), in.data(), size_t(in.size()));
            return out;
        }
        QStringView operator()(QUtf8StringView in)
        {
            out.resize(in.size());
            return QStringView{out.data(), QUtf8::convertToUnicode(out.data(), in)};
        }
    } convert;

    QStringView sv = a.visit(std::ref(convert));
    return replaceArgEscapes(*this, d, fieldWidth, sv, sv, fillChar);
}